

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::internal::BenchmarkImp::ThreadPerCpu(BenchmarkImp *this)

{
  iterator __position;
  int iVar1;
  
  if (ThreadPerCpu()::num_cpus == '\0') {
    iVar1 = __cxa_guard_acquire(&ThreadPerCpu()::num_cpus);
    if (iVar1 != 0) {
      ThreadPerCpu::num_cpus = NumCPUs();
      __cxa_guard_release(&ThreadPerCpu()::num_cpus);
    }
  }
  __position._M_current =
       (this->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *__position._M_current = ThreadPerCpu::num_cpus;
    (this->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
    return;
  }
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&this->thread_counts_,__position,
             &ThreadPerCpu::num_cpus);
  return;
}

Assistant:

void BenchmarkImp::ThreadPerCpu() {
  static int num_cpus = NumCPUs();
  thread_counts_.push_back(num_cpus);
}